

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<char_const(&)[3],kj::StringPtr&,char_const(&)[8],kj::String&,char_const(&)[11]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [3],StringPtr *params_1,
          char (*params_2) [8],String *params_3,char (*params_4) [11])

{
  char acVar1 [8];
  ArrayPtr<const_char> *in_stack_ffffffffffffff78;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  kj *local_60;
  char *local_58;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_58 = (char *)strlen((char *)this);
  local_70.ptr = *(char **)params;
  local_70.size_ = *(long *)(params[2] + 2) - 1;
  local_60 = this;
  local_80.size_ = strlen((char *)params_1);
  acVar1 = params_2[1];
  local_40.ptr = (char *)acVar1;
  if (acVar1 != (char  [8])0x0) {
    local_40.ptr = *(char **)params_2;
  }
  local_40.size_ = 0;
  if (acVar1 != (char  [8])0x0) {
    local_40.size_ = (long)acVar1 - 1;
  }
  local_80.ptr = (char *)params_1;
  local_50.size_ = strlen((char *)params_3);
  local_50.ptr = (char *)params_3;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_60,&local_70,&local_80,&local_40,&local_50,
             in_stack_ffffffffffffff78);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}